

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

bool __thiscall QIODevice::canReadLine(QIODevice *this)

{
  QIODevicePrivate *this_00;
  QRingBuffer *pQVar1;
  bool bVar2;
  qint64 qVar3;
  qint64 pos;
  
  this_00 = (QIODevicePrivate *)(this->super_QObject).d_ptr.d;
  pQVar1 = (this_00->buffer).m_buf;
  if (pQVar1 == (QRingBuffer *)0x0) {
    qVar3 = 0;
  }
  else {
    qVar3 = pQVar1->bufferSize;
  }
  bVar2 = QIODevicePrivate::isSequential(this_00);
  if (bVar2) {
    pos = this_00->transactionPos;
  }
  else {
    pos = 0;
  }
  qVar3 = QIODevicePrivate::QRingBufferRef::indexOf(&this_00->buffer,'\n',qVar3,pos);
  return -1 < qVar3;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }